

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall CLayerGroup::SwapLayers(CLayerGroup *this,int Index0,int Index1)

{
  int iVar1;
  CLayer **__a;
  CLayer **__b;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int local_4;
  
  local_4 = in_ESI;
  if ((((-1 < in_ESI) &&
       (iVar1 = array<CLayer_*,_allocator_default<CLayer_*>_>::size
                          ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1)),
       in_ESI < iVar1)) && (-1 < in_EDX)) &&
     ((iVar1 = array<CLayer_*,_allocator_default<CLayer_*>_>::size
                         ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1)),
      in_EDX < iVar1 && (in_ESI != in_EDX)))) {
    *(undefined1 *)(*in_RDI + 8) = 1;
    __a = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                    ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1),in_ESI);
    __b = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                    ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1),in_EDX);
    std::swap<CLayer*>(__a,__b);
    local_4 = in_EDX;
  }
  return local_4;
}

Assistant:

int CLayerGroup::SwapLayers(int Index0, int Index1)
{
	if(Index0 < 0 || Index0 >= m_lLayers.size()) return Index0;
	if(Index1 < 0 || Index1 >= m_lLayers.size()) return Index0;
	if(Index0 == Index1) return Index0;
	m_pMap->m_Modified = true;
	std::swap(m_lLayers[Index0], m_lLayers[Index1]);
	return Index1;
}